

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

bool QCoreApplicationPrivate::notify_helper(QObject *receiver,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RSI;
  long *in_RDI;
  QEvent *unaff_retaddr;
  bool filtered;
  QEvent *in_stack_00000008;
  bool consumed;
  bool local_1;
  
  bVar1 = QThread::isMainThread();
  if ((bVar1) && (QCoreApplication::self != (QCoreApplication *)0x0)) {
    QCoreApplication::d_func((QCoreApplication *)0x33f153);
    bVar1 = sendThroughApplicationEventFilters
                      ((QCoreApplicationPrivate *)event,(QObject *)in_stack_00000008,unaff_retaddr);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = sendThroughObjectEventFilters((QObject *)event,in_stack_00000008);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar2 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI);
    local_1 = (bool)(bVar2 & 1);
  }
  return local_1;
}

Assistant:

bool QCoreApplicationPrivate::notify_helper(QObject *receiver, QEvent * event)
{
    // Note: when adjusting the tracepoints in here
    // consider adjusting QApplicationPrivate::notify_helper too.
    Q_TRACE(QCoreApplication_notify_entry, receiver, event, event->type());
    bool consumed = false;
    bool filtered = false;
    Q_TRACE_EXIT(QCoreApplication_notify_exit, consumed, filtered);

    // send to all application event filters (only does anything in the main thread)
    if (QThread::isMainThread()
            && QCoreApplication::self
            && QCoreApplication::self->d_func()->sendThroughApplicationEventFilters(receiver, event)) {
        filtered = true;
        return filtered;
    }
    // send to all receiver event filters
    if (sendThroughObjectEventFilters(receiver, event)) {
        filtered = true;
        return filtered;
    }

    // deliver the event
    consumed = receiver->event(event);
    return consumed;
}